

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

bool __thiscall QSQLiteResult::exec(QSQLiteResult *this)

{
  undefined1 *this_00;
  QSQLiteResultPrivate *this_01;
  long lVar1;
  sqlite3_stmt *psVar2;
  double rValue;
  char cVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  long *plVar10;
  QSQLiteDriverPrivate *pQVar11;
  sqlite_int64 iValue;
  long lVar12;
  char *pcVar13;
  undefined8 *puVar14;
  QVariant *pQVar15;
  PrivateShared *pPVar16;
  ulong uVar17;
  sqlite3 *descr;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QStringView QVar20;
  QByteArrayView QVar21;
  bool local_108;
  QArrayDataPointer<int> local_e0;
  QByteArrayView local_c8;
  char *parameterName;
  int local_ac;
  QArrayDataPointer<char16_t> local_a8;
  QTime time;
  undefined4 uStack_84;
  piter local_68;
  undefined1 *local_58;
  QArrayDataPointer<QVariant> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSQLiteResultPrivate **)&this->field_0x8;
  plVar10 = (long *)QSqlResult::boundValues();
  local_50.d = (Data *)*plVar10;
  local_50.ptr = (QVariant *)plVar10[1];
  local_50.size = plVar10[2];
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01->skippedStatus = false;
  this_01->skipRow = false;
  QSqlRecord::clear();
  QSqlCachedResult::clearValues();
  local_58 = (undefined1 *)0x0;
  local_68.d = (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)0x0;
  local_68.bucket = 0;
  _time = (sqlite3_vfs *)0x0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  QSqlError::QSqlError
            ((QSqlError *)&local_e0,(QString *)&local_68,(QString *)&time,NoError,
             (QString *)&local_a8);
  (**(code **)(*(long *)this + 0x28))(this,&local_e0);
  QSqlError::~QSqlError((QSqlError *)&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&time);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  iVar6 = sqlite3_reset(this_01->stmt);
  if (iVar6 == 0) {
    uVar7 = sqlite3_bind_parameter_count(this_01->stmt);
    if ((int)uVar7 < local_50.size && 0 < (int)uVar7) {
      this_00 = &(this_01->super_QSqlCachedResultPrivate).field_0x78;
      local_68 = (piter)QHash<QString,_QList<int>_>::cbegin((QHash<QString,_QList<int>_> *)this_00);
      iVar6 = 0;
      while( true ) {
        if (local_68.d == (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)0x0 &&
            local_68.bucket == 0) break;
        lVar1 = *(long *)(local_68.d + 0x20);
        lVar12 = (local_68.bucket >> 7) * 0x90;
        iVar6 = iVar6 + *(int *)(*(long *)(lVar1 + 0x80 + lVar12) + 0x28 +
                                (ulong)*(byte *)((ulong)((uint)local_68.bucket & 0x7f) +
                                                lVar1 + lVar12) * 0x30);
        QHashPrivate::iterator<QHashPrivate::Node<QString,_QList<int>_>_>::operator++(&local_68);
      }
      bVar19 = local_50.size == iVar6;
      local_68.d = (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)0x0;
      local_68.bucket = 0;
      local_58 = (undefined1 *)0x0;
      _time = (sqlite3_vfs *)0x0;
      iVar6 = 0;
      for (local_ac = 0; local_ac < local_50.size; local_ac = local_ac + 1) {
        bVar4 = QListSpecialMethodsBase<int>::contains<int>
                          ((QListSpecialMethodsBase<int> *)&time,&local_ac);
        if (!bVar4) {
          parameterName = sqlite3_bind_parameter_name(this_01->stmt,iVar6 + 1);
          if (parameterName == (char *)0x0) {
            bVar19 = false;
          }
          else {
            local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QByteArrayView::QByteArrayView<const_char_*,_true>(&local_c8,&parameterName);
            QVar21.m_data = (storage_type_conflict *)local_c8.m_size;
            QVar21.m_size = (qsizetype)&local_a8;
            QString::fromUtf8(QVar21);
            QHash<QString,_QList<int>_>::value
                      ((QList<int> *)&local_e0,(QHash<QString,_QList<int>_> *)this_00,
                       (QString *)&local_a8);
            QList<int>::append((QList<int> *)&time,(QList<int> *)&local_e0);
            QList<QVariant>::emplaceBack<QVariant_const&>
                      ((QList<QVariant> *)&local_68,local_50.ptr + *local_e0.ptr);
            QArrayDataPointer<int>::~QArrayDataPointer(&local_e0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            iVar6 = iVar6 + 1;
          }
        }
      }
      QArrayDataPointer<QVariant>::operator=(&local_50,(QArrayDataPointer<QVariant> *)&local_68);
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&time);
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_68);
      if (bVar19) {
LAB_0011302d:
        uVar18 = 0;
        uVar17 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar17 = uVar18;
        }
        do {
          if (uVar18 == uVar17) {
            bVar19 = QSQLiteResultPrivate::fetchNext(this_01,&this_01->firstRow,0,true);
            this_01->skippedStatus = bVar19;
            QSqlResult::lastError();
            cVar3 = QSqlError::isValid();
            QSqlError::~QSqlError((QSqlError *)&local_68);
            if (cVar3 == '\0') {
              bVar5 = QSqlRecord::isEmpty();
              (**(code **)(*(long *)this + 0x38))(this,bVar5 ^ 1);
              (**(code **)(*(long *)this + 0x20))(this,1);
              local_108 = true;
            }
            else {
              local_108 = false;
              (**(code **)(*(long *)this + 0x38))(this,0);
              (**(code **)(*(long *)this + 0x20))(this,0);
            }
            goto LAB_001135f1;
          }
          pPVar16 = (PrivateShared *)(local_50.ptr + uVar18);
          cVar3 = QSqlResultPrivate::isVariantNull((QVariant *)pPVar16);
          iVar6 = (int)uVar18;
          if (cVar3 != '\0') {
            iVar6 = sqlite3_bind_null(this_01->stmt,iVar6 + 1);
            goto LAB_00113080;
          }
          iVar8 = QVariant::typeId((QVariant *)pPVar16);
          switch(iVar8) {
          case 1:
          case 2:
            psVar2 = this_01->stmt;
            iVar8 = QVariant::toInt((bool *)pPVar16);
            iVar6 = sqlite3_bind_int(psVar2,iVar6 + 1,iVar8);
            break;
          case 3:
          case 4:
            psVar2 = this_01->stmt;
            iValue = QVariant::toLongLong((bool *)pPVar16);
            iVar6 = sqlite3_bind_int64(psVar2,iVar6 + 1,iValue);
            break;
          default:
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            local_68.d = (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            QVariant::toString();
            goto LAB_001132e1;
          case 6:
            psVar2 = this_01->stmt;
            rValue = (double)QVariant::toDouble((bool *)pPVar16);
            iVar6 = sqlite3_bind_double(psVar2,iVar6 + 1,rValue);
            break;
          case 10:
            if (((byte)pPVar16[0x18] & 1) != 0) {
              pPVar16 = (PrivateShared *)
                        ((long)*(int *)(*(long *)&pPVar16->field_0x0 + 4) +
                        *(long *)&pPVar16->field_0x0);
            }
            puVar14 = *(undefined8 **)((long)&(((QVariant *)pPVar16)->d).data + 8);
            if (puVar14 == (undefined8 *)0x0) {
              puVar14 = &QString::_empty;
            }
            iVar6 = sqlite3_bind_text16(this_01->stmt,iVar6 + 1,puVar14,
                                        *(int *)((long)&(((QVariant *)pPVar16)->d).data + 0x10) * 2,
                                        (_func_void_void_ptr *)0x0);
            break;
          case 0xc:
            if ((pPVar16[0x18].field_0x0 & 1) != 0) {
              pPVar16 = (((Private *)&pPVar16->field_0x0)->data).shared;
              pPVar16 = pPVar16 + *(int *)(pPVar16 + 4);
            }
            puVar14 = *(undefined8 **)&pPVar16[8].field_0x0;
            if (puVar14 == (undefined8 *)0x0) {
              puVar14 = &QByteArray::_empty;
            }
            iVar6 = sqlite3_bind_blob(this_01->stmt,iVar6 + 1,puVar14,
                                      *(int *)&pPVar16[0x10].field_0x0,(_func_void_void_ptr *)0x0);
            break;
          case 0xf:
            time.mds = -0x55555556;
            uVar9 = QVariant::toTime();
            _time = (sqlite3_vfs *)CONCAT44(uStack_84,uVar9);
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            local_68.d = (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            QVar20.m_data = (storage_type *)&time;
            QVar20.m_size = (qsizetype)&local_68;
            QTime::toString(QVar20);
LAB_001132e1:
            pQVar15 = (QVariant *)local_68.bucket;
            if ((QVariant *)local_68.bucket == (QVariant *)0x0) {
              pQVar15 = (QVariant *)&QString::_empty;
            }
            iVar6 = sqlite3_bind_text16(this_01->stmt,iVar6 + 1,pQVar15,(int)local_58 * 2,
                                        (_func_void_void_ptr *)0xffffffffffffffff);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_68);
            break;
          case 0x10:
            _time = (sqlite3_vfs *)&DAT_aaaaaaaaaaaaaaaa;
            QVariant::toDateTime();
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            local_68.d = (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            QDateTime::toString((DateFormat)(QArrayDataPointer<char16_t> *)&local_68);
            pQVar15 = (QVariant *)local_68.bucket;
            if ((QVariant *)local_68.bucket == (QVariant *)0x0) {
              pQVar15 = (QVariant *)&QString::_empty;
            }
            iVar6 = sqlite3_bind_text16(this_01->stmt,iVar6 + 1,pQVar15,(int)local_58 * 2,
                                        (_func_void_void_ptr *)0xffffffffffffffff);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_68);
            QDateTime::~QDateTime((QDateTime *)&time);
          }
LAB_00113080:
          uVar18 = uVar18 + 1;
        } while (iVar6 == 0);
        pQVar11 = QSQLiteResultPrivate::drv_d_func(this_01);
        descr = pQVar11->access;
        pcVar13 = "Unable to bind parameters";
        goto LAB_00112f18;
      }
    }
    else if (local_50.size == (int)uVar7) goto LAB_0011302d;
    local_108 = false;
    QCoreApplication::translate((char *)&local_68,"QSQLiteResult","Parameter count mismatch",0);
    _time = (sqlite3_vfs *)0x0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QSqlError::QSqlError
              ((QSqlError *)&local_e0,(QString *)&local_68,(QString *)&time,StatementError,
               (QString *)&local_a8);
    (**(code **)(*(long *)this + 0x28))(this,&local_e0);
    QSqlError::~QSqlError((QSqlError *)&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&time);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  else {
    pQVar11 = QSQLiteResultPrivate::drv_d_func(this_01);
    descr = pQVar11->access;
    pcVar13 = "Unable to reset statement";
LAB_00112f18:
    local_108 = false;
    QCoreApplication::translate((char *)&local_68,"QSQLiteResult",pcVar13,0);
    qMakeError((sqlite3 *)&time,(QString *)descr,(ErrorType)(QArrayDataPointer<char16_t> *)&local_68
               ,2);
    (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)&time);
    QSqlError::~QSqlError((QSqlError *)&time);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QSQLiteResultPrivate::finalize(this_01);
  }
LAB_001135f1:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_108;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::exec()
{
    Q_D(QSQLiteResult);
    QList<QVariant> values = boundValues();

    d->skippedStatus = false;
    d->skipRow = false;
    d->rInf.clear();
    clearValues();
    setLastError(QSqlError());

    int res = sqlite3_reset(d->stmt);
    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to reset statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    }

    int paramCount = sqlite3_bind_parameter_count(d->stmt);
    bool paramCountIsValid = paramCount == values.size();

#if (SQLITE_VERSION_NUMBER >= 3003011)
    // In the case of the reuse of a named placeholder
    // We need to check explicitly that paramCount is greater than or equal to 1, as sqlite
    // can end up in a case where for virtual tables it returns 0 even though it
    // has parameters
    if (paramCount >= 1 && paramCount < values.size()) {
        const auto countIndexes = [](int counter, const QList<int> &indexList) {
                                      return counter + indexList.size();
                                  };

        const int bindParamCount = std::accumulate(d->indexes.cbegin(),
                                                   d->indexes.cend(),
                                                   0,
                                                   countIndexes);

        paramCountIsValid = bindParamCount == values.size();
        // When using named placeholders, it will reuse the index for duplicated
        // placeholders. So we need to ensure the QList has only one instance of
        // each value as SQLite will do the rest for us.
        QList<QVariant> prunedValues;
        QList<int> handledIndexes;
        for (int i = 0, currentIndex = 0; i < values.size(); ++i) {
            if (handledIndexes.contains(i))
                continue;
            const char *parameterName = sqlite3_bind_parameter_name(d->stmt, currentIndex + 1);
            if (!parameterName) {
                paramCountIsValid = false;
                continue;
            }
            const auto placeHolder = QString::fromUtf8(parameterName);
            const auto &indexes = d->indexes.value(placeHolder);
            handledIndexes << indexes;
            prunedValues << values.at(indexes.first());
            ++currentIndex;
        }
        values = prunedValues;
    }
#endif

    if (paramCountIsValid) {
        for (int i = 0; i < paramCount; ++i) {
            res = SQLITE_OK;
            const QVariant &value = values.at(i);

            if (QSqlResultPrivate::isVariantNull(value)) {
                res = sqlite3_bind_null(d->stmt, i + 1);
            } else {
                switch (value.userType()) {
                case QMetaType::QByteArray: {
                    const QByteArray *ba = static_cast<const QByteArray*>(value.constData());
                    res = sqlite3_bind_blob(d->stmt, i + 1, ba->constData(),
                                            ba->size(), SQLITE_STATIC);
                    break; }
                case QMetaType::Int:
                case QMetaType::Bool:
                    res = sqlite3_bind_int(d->stmt, i + 1, value.toInt());
                    break;
                case QMetaType::Double:
                    res = sqlite3_bind_double(d->stmt, i + 1, value.toDouble());
                    break;
                case QMetaType::UInt:
                case QMetaType::LongLong:
                    res = sqlite3_bind_int64(d->stmt, i + 1, value.toLongLong());
                    break;
                case QMetaType::QDateTime: {
                    const QDateTime dateTime = value.toDateTime();
                    const QString str = dateTime.toString(Qt::ISODateWithMs);
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QTime: {
                    const QTime time = value.toTime();
                    const QString str = time.toString(u"hh:mm:ss.zzz");
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QString: {
                    // lifetime of string == lifetime of its qvariant
                    const QString *str = static_cast<const QString*>(value.constData());
                    res = sqlite3_bind_text16(d->stmt, i + 1, str->unicode(),
                                              int(str->size()) * sizeof(QChar),
                                              SQLITE_STATIC);
                    break; }
                default: {
                    const QString str = value.toString();
                    // SQLITE_TRANSIENT makes sure that sqlite buffers the data
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size()) * sizeof(QChar),
                                              SQLITE_TRANSIENT);
                    break; }
                }
            }
            if (res != SQLITE_OK) {
                setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                             "Unable to bind parameters"), QSqlError::StatementError, res));
                d->finalize();
                return false;
            }
        }
    } else {
        setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult",
                        "Parameter count mismatch"), QString(), QSqlError::StatementError));
        return false;
    }
    d->skippedStatus = d->fetchNext(d->firstRow, 0, true);
    if (lastError().isValid()) {
        setSelect(false);
        setActive(false);
        return false;
    }
    setSelect(!d->rInf.isEmpty());
    setActive(true);
    return true;
}